

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutput_Test::
~TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutput_Test
          (TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutput_Test *this)

{
  TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutput_Test *this_local;
  
  ~TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutput_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST(JUnitOutputTest, UTPRINTOutputInJUnitOutput)
{
    testCaseRunner->start()
            .withGroup("groupname")
            .withTest("testname").thatPrints("someoutput")
            .end();

    outputFile = fileSystem.file("cpputest_groupname.xml");
    STRCMP_EQUAL("<system-out>someoutput</system-out>\n", outputFile->lineFromTheBack(3));
}